

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O3

int __thiscall crnlib::console::vprintf(console *this,char *__format,__gnuc_va_list __arg)

{
  bool bVar1;
  mutex *this_00;
  byte bVar2;
  int extraout_EAX;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  uint i;
  ulong uVar8;
  byte bVar9;
  dynamic_string tmp_buf;
  char buf [4096];
  dynamic_string dStack_1048;
  char local_1038 [4104];
  
  init((EVP_PKEY_CTX *)this);
  this_00 = m_pMutex;
  mutex::lock(m_pMutex);
  iVar5 = (int)this;
  *(int *)(m_num_messages + ((ulong)this & 0xffffffff) * 4) =
       *(int *)(m_num_messages + ((ulong)this & 0xffffffff) * 4) + 1;
  vsprintf_s(local_1038,0x1000,__format,(__va_list_tag *)__arg);
  if (DAT_001d39d8 == 0) {
    bVar9 = 0;
  }
  else {
    lVar7 = 8;
    uVar8 = 0;
    bVar9 = 0;
    do {
      bVar2 = (**(code **)(m_output_funcs + -8 + lVar7))
                        ((ulong)this & 0xffffffff,local_1038,*(undefined8 *)(m_output_funcs + lVar7)
                        );
      bVar9 = bVar9 | bVar2;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar8 < DAT_001d39d8);
  }
  bVar1 = true;
  if ((m_prefixes == '\x01') && (m_at_beginning_of_line == '\x01')) {
    if (iVar5 == 6) {
      pcVar6 = "Error: ";
    }
    else if (iVar5 == 5) {
      pcVar6 = "Warning: ";
    }
    else {
      if (iVar5 != 0) goto LAB_0011007f;
      pcVar6 = "Debug: ";
    }
    bVar1 = false;
  }
  else {
LAB_0011007f:
    pcVar6 = (char *)0x0;
  }
  if (((bVar9 | m_output_disabled) & 1) == 0) {
    if (!bVar1) {
      ::printf("%s",pcVar6);
    }
    pcVar6 = "%s";
    if (m_crlf != '\0') {
      pcVar6 = "%s\n";
    }
    ::printf(pcVar6,local_1038);
  }
  sVar3 = strlen(local_1038);
  m_at_beginning_of_line = true;
  if (m_crlf == '\0') {
    if ((int)sVar3 == 0) {
      m_at_beginning_of_line = false;
    }
    else {
      m_at_beginning_of_line = local_1038[(int)sVar3 - 1] == '\n';
    }
  }
  if ((iVar5 != 1) && (m_pLog_stream != (data_stream *)0x0)) {
    dynamic_string::dynamic_string(&dStack_1048,local_1038);
    dynamic_string::translate_lf_to_crlf(&dStack_1048);
    pcVar6 = "%s";
    if (m_crlf != '\0') {
      pcVar6 = "%s\r\n";
    }
    pcVar4 = "";
    if (dStack_1048.m_pStr != (char *)0x0) {
      pcVar4 = dStack_1048.m_pStr;
    }
    data_stream::printf(m_pLog_stream,pcVar6,pcVar4);
    (*m_pLog_stream->_vptr_data_stream[7])();
    if ((dStack_1048.m_pStr != (char *)0x0) &&
       ((*(uint *)(dStack_1048.m_pStr + -8) ^ *(uint *)(dStack_1048.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(dStack_1048.m_pStr + -0x10);
    }
  }
  mutex::unlock(this_00);
  return extraout_EAX;
}

Assistant:

void console::vprintf(eConsoleMessageType type, const char* p, va_list args)
    {
        init();

        scoped_mutex lock(*m_pMutex);

        m_num_messages[type]++;

        char buf[cConsoleBufSize];
        vsprintf_s(buf, cConsoleBufSize, p, args);

        bool handled = false;

        if (m_output_funcs.size())
        {
            for (uint i = 0; i < m_output_funcs.size(); i++)
            {
                if (m_output_funcs[i].m_func(type, buf, m_output_funcs[i].m_pData))
                {
                    handled = true;
                }
            }
        }

        const char* pPrefix = nullptr;
        if ((m_prefixes) && (m_at_beginning_of_line))
        {
            switch (type)
            {
            case cDebugConsoleMessage:
                pPrefix = "Debug: ";
                break;
            case cWarningConsoleMessage:
                pPrefix = "Warning: ";
                break;
            case cErrorConsoleMessage:
                pPrefix = "Error: ";
                break;
            default:
                break;
            }
        }

        if ((!m_output_disabled) && (!handled))
        {
            if (pPrefix)
            {
                ::printf("%s", pPrefix);
            }
            ::printf(m_crlf ? "%s\n" : "%s", buf);
        }

        uint n = strlen(buf);
        m_at_beginning_of_line = (m_crlf) || ((n) && (buf[n - 1] == '\n'));

        if ((type != cProgressConsoleMessage) && (m_pLog_stream))
        {
            // Yes this is bad.
            dynamic_string tmp_buf(buf);

            tmp_buf.translate_lf_to_crlf();

            m_pLog_stream->printf(m_crlf ? "%s\r\n" : "%s", tmp_buf.get_ptr());
            m_pLog_stream->flush();
        }
    }